

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this)

{
  uint __tmp;
  uint uVar1;
  long lVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_short,_(unsigned_char)__b_> local_18;
  
  uVar1 = Pop<unsigned_int>(this);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 2) {
    *(short *)((long)local_18.v + lVar2) = (short)uVar1;
  }
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,local_18);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}